

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O1

void funcargs(LexState *ls,expdesc *f)

{
  int where;
  int iVar1;
  FuncState *fs;
  int iVar2;
  expdesc args;
  expdesc local_40;
  
  fs = ls->fs;
  where = ls->linenumber;
  iVar1 = (ls->t).token;
  if (iVar1 == 0x11e) {
    local_40.u.s.info = luaK_stringK(fs,(ls->t).seminfo.ts);
    local_40.t = -1;
    local_40.f = -1;
    local_40.k = VK;
    luaX_next(ls);
  }
  else if (iVar1 == 0x7b) {
    constructor(ls,&local_40);
  }
  else {
    if (iVar1 != 0x28) {
      luaX_syntaxerror(ls,"function arguments expected");
      return;
    }
    if (where != ls->lastline) {
      luaX_syntaxerror(ls,"ambiguous syntax (function call x new statement)");
    }
    luaX_next(ls);
    if ((ls->t).token == 0x29) {
      local_40.k = VVOID;
    }
    else {
      explist1(ls,&local_40);
      luaK_setreturns(fs,&local_40,-1);
    }
    check_match(ls,0x29,0x28,where);
  }
  iVar1 = (f->u).s.info;
  iVar2 = 0;
  if (1 < local_40.k - VCALL) {
    if (local_40.k != VVOID) {
      luaK_exp2nextreg(fs,&local_40);
    }
    iVar2 = fs->freereg - iVar1;
  }
  iVar2 = luaK_codeABC(fs,OP_CALL,iVar1,iVar2,2);
  f->t = -1;
  f->f = -1;
  f->k = VCALL;
  (f->u).s.info = iVar2;
  luaK_fixline(fs,where);
  fs->freereg = iVar1 + 1;
  return;
}

Assistant:

static void funcargs (LexState *ls, expdesc *f) {
  FuncState *fs = ls->fs;
  expdesc args;
  int base, nparams;
  int line = ls->linenumber;
  switch (ls->t.token) {
    case '(': {  /* funcargs -> `(' [ explist1 ] `)' */
      if (line != ls->lastline)
        luaX_syntaxerror(ls,"ambiguous syntax (function call x new statement)");
      luaX_next(ls);
      if (ls->t.token == ')')  /* arg list is empty? */
        args.k = VVOID;
      else {
        explist1(ls, &args);
        luaK_setmultret(fs, &args);
      }
      check_match(ls, ')', '(', line);
      break;
    }
    case '{': {  /* funcargs -> constructor */
      constructor(ls, &args);
      break;
    }
    case TK_STRING: {  /* funcargs -> STRING */
      codestring(ls, &args, ls->t.seminfo.ts);
      luaX_next(ls);  /* must use `seminfo' before `next' */
      break;
    }
    default: {
      luaX_syntaxerror(ls, "function arguments expected");
      return;
    }
  }
  lua_assert(f->k == VNONRELOC);
  base = f->u.s.info;  /* base register for call */
  if (hasmultret(args.k))
    nparams = LUA_MULTRET;  /* open call */
  else {
    if (args.k != VVOID)
      luaK_exp2nextreg(fs, &args);  /* close last argument */
    nparams = fs->freereg - (base+1);
  }
  init_exp(f, VCALL, luaK_codeABC(fs, OP_CALL, base, nparams+1, 2));
  luaK_fixline(fs, line);
  fs->freereg = base+1;  /* call remove function and arguments and leaves
                            (unless changed) one result */
}